

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

Path * __thiscall Pathie::Path::join(Path *__return_storage_ptr__,Path *this,string *str)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&local_38,&this->m_path,"/");
  std::operator+(&bStack_58,&local_38,str);
  Path(__return_storage_ptr__,&bStack_58);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

Path Path::join(std::string str) const
{
  Path path(m_path + "/" + str);
  return path;
}